

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fade.cpp
# Opt level: O1

void __thiscall
Fade::mergeCategoricalValues
          (Fade *this,vector<double,_std::allocator<double>_> *out,int *outOffsets,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *in,vector<int_*,_std::allocator<int_*>_> *inOffsets)

{
  double *pdVar1;
  uint uVar2;
  int iVar3;
  pointer pvVar4;
  iterator iVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  double *pdVar15;
  long lVar16;
  int iVar17;
  double dVar18;
  ulong uVar19;
  double *pdVar20;
  int *piVar21;
  int *__s;
  double *pdVar22;
  double dVar23;
  int aiStack_f0 [2];
  double local_e8;
  ulong local_e0;
  pointer local_d8;
  pointer local_d0;
  vector<int_*,_std::allocator<int_*>_> *local_c8;
  int *local_c0;
  Fade *local_b8;
  long local_b0;
  long local_a8;
  ulong local_a0;
  double local_98;
  vector<double,std::allocator<double>> *local_90;
  double *local_88;
  int *local_80;
  int local_78;
  uint local_74;
  double *local_70;
  long local_68;
  ulong local_60;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_58;
  double local_50;
  double agg;
  ulong local_40;
  uint local_34;
  
  lVar9 = (long)((this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_root
                ->_id;
  lVar13 = (long)this->_numberOfAggregatesPerNode[dfdb::params::NUM_OF_ATTRIBUTES * 2 + lVar9];
  local_a8 = (long)this->_numberOfAggregatesPerNode[dfdb::params::NUM_OF_ATTRIBUTES * 3 + lVar9];
  local_60 = ((long)(in->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(in->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  pdVar22 = &local_e8 + dfdb::params::DEGREE_OF_INTERACTIONS * -2;
  pdVar20 = pdVar22 + dfdb::params::DEGREE_OF_INTERACTIONS * -2;
  iVar8 = (int)local_60;
  __s = (int *)((long)pdVar20 - ((local_60 & 0xffffffff) * 4 + 0xf & 0xfffffffffffffff0));
  local_c8 = inOffsets;
  local_c0 = outOffsets;
  local_b8 = this;
  local_58 = in;
  __s[-2] = 0x12e545;
  __s[-1] = 0;
  memset(__s,0,(long)iVar8 << 2);
  local_b0 = lVar13;
  if (0 < lVar13) {
    local_a0 = (ulong)((uint)local_60 & 0x7fffffff);
    local_68 = 0;
    local_70 = pdVar20;
    local_90 = (vector<double,std::allocator<double>> *)out;
    local_88 = pdVar22;
    local_80 = __s;
    piVar21 = __s;
    do {
      uVar2 = local_b8->_degreeOfCategoricalAggregateGroup[local_68 + local_a8];
      dVar18 = (double)(long)(int)uVar2;
      if (0 < (long)dVar18) {
        iVar8 = *piVar21;
        lVar9 = *(long *)&(((local_58->
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data;
        uVar10 = 0;
        do {
          pdVar22[uVar10] = *(double *)((long)iVar8 * 8 + lVar9 + uVar10 * 8);
          pdVar20[uVar10] = 1.79769313486232e+308;
          uVar10 = uVar10 + 1;
        } while (uVar2 != uVar10);
      }
      local_40 = (ulong)uVar2;
      agg = dVar18;
      if (1 < (int)local_60) {
        pvVar4 = (local_58->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar10 = 1;
        do {
          if (0 < SUB84(dVar18,0)) {
            lVar13 = (long)piVar21[uVar10] * 8 +
                     *(long *)&pvVar4[uVar10].super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data;
            lVar16 = 0;
            uVar14 = local_40;
            pdVar15 = pdVar22;
            lVar9 = lVar13;
            do {
              pdVar1 = (double *)(lVar13 + lVar16 * 8);
              if (*pdVar1 <= pdVar22[lVar16] && pdVar22[lVar16] != *pdVar1) {
                uVar19 = 0;
                do {
                  pdVar15[uVar19] = *(double *)(lVar9 + uVar19 * 8);
                  uVar19 = uVar19 + 1;
                } while (uVar14 != uVar19);
              }
              dVar23 = *(double *)(lVar13 + lVar16 * 8);
              dVar18 = agg;
              if (pdVar22[lVar16] <= dVar23 && dVar23 != pdVar22[lVar16]) break;
              lVar16 = lVar16 + 1;
              lVar9 = lVar9 + 8;
              pdVar15 = pdVar15 + 1;
              uVar14 = uVar14 - 1;
            } while (lVar16 < (long)agg);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != local_a0);
      }
      local_78 = SUB84(dVar18,0) + 1;
      local_74 = (int)local_40 - 1;
      lVar9 = local_68;
      uVar10 = local_40;
      do {
        local_50 = 0.0;
        if ((int)local_60 < 1) {
          local_34 = 0;
        }
        else {
          local_98 = 0.0;
          local_d8 = (local_c8->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          local_d0 = (local_58->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          uVar14 = 0;
          local_34 = 0;
          do {
            iVar8 = piVar21[uVar14];
            iVar3 = local_d8[uVar14][lVar9];
            if (iVar8 < iVar3) {
              pvVar4 = local_d0 + uVar14;
              iVar17 = SUB84(dVar18,0);
              if ((int)uVar10 < 1) {
LAB_0012e756:
                local_98 = local_98 +
                           *(double *)
                            (*(long *)&(pvVar4->super__Vector_base<double,_std::allocator<double>_>)
                                       ._M_impl.super__Vector_impl_data + (long)(iVar17 + iVar8) * 8
                            );
                local_50 = local_98;
                piVar21[uVar14] = iVar8 + local_78;
              }
              else {
                bVar11 = true;
                lVar9 = 1;
                do {
                  dVar23 = *(double *)
                            ((long)iVar8 * 8 +
                             *(long *)&(pvVar4->super__Vector_base<double,_std::allocator<double>_>)
                                       ._M_impl.super__Vector_impl_data + -8 + lVar9 * 8);
                  bVar6 = NAN(pdVar22[lVar9 + -1]);
                  bVar7 = dVar23 != pdVar22[lVar9 + -1];
                  if (bVar7) {
                    bVar11 = false;
                  }
                  if (NAN(dVar23) || bVar6) {
                    bVar11 = false;
                  }
                } while (((!bVar7) && (!NAN(dVar23) && !bVar6)) &&
                        (bVar6 = lVar9 < (long)dVar18, lVar9 = lVar9 + 1, bVar6));
                uVar10 = local_40;
                if (bVar11) goto LAB_0012e756;
              }
              uVar2 = piVar21[uVar14];
              bVar11 = (int)uVar2 < iVar3 && iVar17 < 1;
              if (((int)uVar2 < iVar3) && (0 < iVar17)) {
                lVar9 = *(long *)&(pvVar4->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data;
                local_e0 = (ulong)uVar2;
                uVar19 = 0;
                uVar12 = local_74;
                do {
                  dVar23 = *(double *)(lVar9 + (long)(int)uVar2 * 8 + uVar19 * 8);
                  if (dVar23 < pdVar20[uVar19]) {
                    iVar8 = (int)local_e0;
                    local_e8 = dVar23;
                    __s[-2] = 0x12e7f8;
                    __s[-1] = 0;
                    memcpy(pdVar20 + uVar19,(void *)(lVar9 + (long)(iVar8 + (int)uVar19) * 8),
                           (ulong)uVar12 * 8 + 8);
                    uVar10 = local_40;
                    dVar18 = agg;
                    pdVar20 = local_70;
                    dVar23 = local_e8;
                  }
                  piVar21 = local_80;
                  out = (vector<double,_std::allocator<double>_> *)local_90;
                  pdVar22 = local_88;
                  if (pdVar20[uVar19] <= dVar23 && dVar23 != pdVar20[uVar19]) {
                    bVar11 = false;
                    goto LAB_0012e839;
                  }
                  uVar19 = uVar19 + 1;
                  uVar12 = uVar12 - 1;
                } while (uVar10 != uVar19);
                bVar11 = (long)dVar18 <= (long)uVar19;
              }
LAB_0012e839:
              local_34 = local_34 & 0xff;
              if (bVar11) {
                local_34 = 1;
              }
              lVar9 = local_68;
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != local_a0);
        }
        uVar14 = uVar10;
        pdVar15 = pdVar22;
        if (0 < SUB84(dVar18,0)) {
          do {
            iVar5._M_current = *(double **)((long)out + 8);
            if (iVar5._M_current == *(double **)((long)out + 0x10)) {
              __s[-2] = 0x12e89d;
              __s[-1] = 0;
              std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                        ((vector<double,std::allocator<double>> *)out,iVar5,pdVar15);
              uVar14 = local_40;
              dVar18 = agg;
              pdVar20 = local_70;
            }
            else {
              *iVar5._M_current = *pdVar15;
              *(double **)((long)out + 8) = iVar5._M_current + 1;
            }
            pdVar15 = pdVar15 + 1;
            uVar10 = uVar10 - 1;
          } while (uVar10 != 0);
        }
        iVar5._M_current = *(double **)((long)out + 8);
        if (iVar5._M_current == *(double **)((long)out + 0x10)) {
          __s[-2] = 0x12e8db;
          __s[-1] = 0;
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)out,iVar5,&local_50);
          uVar10 = local_40;
          dVar18 = agg;
          pdVar20 = local_70;
        }
        else {
          *iVar5._M_current = local_50;
          *(double **)((long)out + 8) = iVar5._M_current + 1;
          uVar10 = uVar14;
        }
        lVar9 = local_68;
        if (0 < SUB84(dVar18,0)) {
          uVar14 = 0;
          do {
            pdVar22[uVar14] = pdVar20[uVar14];
            pdVar20[uVar14] = 1.79769313486232e+308;
            uVar14 = uVar14 + 1;
          } while (uVar10 != uVar14);
        }
      } while ((local_34 & 1) != 0);
      local_c0[lVar9] = (int)((ulong)(*(long *)((long)out + 8) - *(long *)out) >> 3);
      local_68 = lVar9 + 1;
    } while (local_68 != local_b0);
  }
  return;
}

Assistant:

void Fade::mergeCategoricalValues(vector<double>& out, int* outOffsets,
	std::vector<std::vector<double> > const &in, std::vector<int*> const &inOffsets)
{
	int rootID = _dTree->_root->_id;
	int numOfAggGroups = _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 2 + rootID];
	int firstCatAggOffset = _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 3 + rootID];

	int numOfPartitions = in.size();
        
	double minVal[DEGREE_OF_INTERACTIONS * 2];
	double nextMinVal[DEGREE_OF_INTERACTIONS * 2];

	int pointer[numOfPartitions];
	memset(&pointer[0], 0, sizeof(int) * numOfPartitions);

	for (int aggGroup = 0; aggGroup < numOfAggGroups; ++aggGroup)
	{
		int degreeOfAggGroup = _degreeOfCategoricalAggregateGroup[firstCatAggOffset + aggGroup];

		/* initialize minVal and nextMinVal */
		for (int k = 0; k < degreeOfAggGroup; ++k)
		{
			minVal[k] = in[0][pointer[0] + k];
			nextMinVal[k] = std::numeric_limits<double>::max();
		}

		/* find the minimum value array */
		for (int part = 1; part < numOfPartitions; ++part)
		{
			for (int k = 0; k < degreeOfAggGroup; ++k)
			{
				if (in[part][pointer[part] + k] < minVal[k])
				{
					for (int l = k; l < degreeOfAggGroup; ++l)
						minVal[l] = in[part][pointer[part] + l];
				}
				if (in[part][pointer[part] + k] > minVal[k])
					break;
			}
		}

		bool newValue = true;
		while (newValue)
		{
			double agg = 0.0;
			newValue = false;

			bool isMinVal;

			for (int j = 0; j < numOfPartitions; ++j)
			{
				if (pointer[j] < inOffsets[j][aggGroup])
				{
					auto& a = in[j];

				 	isMinVal = true;

					for (int k = 0; k < degreeOfAggGroup; ++k)
					{
                        int x = pointer[j] + k;

						if (a[x] != minVal[k])
						{
							isMinVal = false;
							break;
						}
					}

					if (isMinVal)
					{
						// printf("isMinVal %d  pointer[j] %d  inOff[j][i] %d \n", isMinVal, pointer[j], inOffsets[j][aggGroup]);
					  	agg += a[pointer[j] + degreeOfAggGroup];
						pointer[j] += degreeOfAggGroup + 1;
					}

					isMinVal = false;

					// printf("id: %d d: %d pointer[j]: %d  childAggCounts[d][j][i]: %d \n", nodeID, d, pointer[j], childAggCounts[d][j][i]);
					if (pointer[j] < inOffsets[j][aggGroup])
					{
						isMinVal = true;

						for (int k = 0; k < degreeOfAggGroup; ++k)
						{
							if (a[pointer[j] + k] < nextMinVal[k])
							{
								for (int l = k; l < degreeOfAggGroup; ++l)
								{
									nextMinVal[l] = a[pointer[j] + l];
								}
							}
							if (a[pointer[j] + k] > nextMinVal[k])
							{
								isMinVal = false;
								break;
							}
                            // printf("nextMinVal: %f \n", nextMinVal[k]);
						}
					}
					// printf("isMinVal %d   Degree:  %lu   nodeID: %d \n", isMinVal, d, nodeID);

					if (isMinVal) newValue = true;
				}
			}

            // printf("nextMinVal: ");
            // for (int k = 0; k < degreeOfAggGroup; ++k)
            //     printf("%.2f ", nextMinVal[k]);
            // printf("\n");

			for (int k = 0; k < degreeOfAggGroup; ++k)
			{
				// printf("minVal entered:  %f \n", minVal[k]);
				out.push_back(minVal[k]);
			}

			//printf("agg entered:  %f \n", agg);
			out.push_back(agg);

			for (int k = 0; k < degreeOfAggGroup; ++k)
			{
				minVal[k] = nextMinVal[k];
				nextMinVal[k] =  std::numeric_limits<double>::max();
			}
		}

		for (int j = 0; j < numOfPartitions; ++j)
			assert(pointer[j] == inOffsets[j][aggGroup]);

		outOffsets[aggGroup] = out.size();
	}

	// printf("outAggregates:  ");	int off = 0;
	// for (size_t i = 0; i < out.size(); ++i) {
	// 	if (i == (size_t) outOffsets[off]) {
	// 		printf(" | "); ++off; }
	// 	printf("%.2f ", out[i]);
	// } printf("\n");
	// printf("outOffsets:  ");
	// for (int i = 0; i < numOfAggGroups; ++i)
	// 	printf("%d ", outOffsets[i]);
	// printf("\n");
}